

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int addBinding(XML_Parser parser,PREFIX *prefix,ATTRIBUTE_ID *attId,XML_Char *uri,
              BINDING **bindingsPtr)

{
  XML_Char *pXVar1;
  XML_Char *local_68;
  int local_44;
  BINDING *pBStack_40;
  int len;
  BINDING *b;
  BINDING **bindingsPtr_local;
  XML_Char *uri_local;
  ATTRIBUTE_ID *attId_local;
  PREFIX *prefix_local;
  XML_Parser parser_local;
  
  for (local_44 = 0; uri[local_44] != '\0'; local_44 = local_44 + 1) {
  }
  if (*(char *)((long)parser + 0x488) != '\0') {
    local_44 = local_44 + 1;
  }
  if (*(long *)((long)parser + 1000) == 0) {
    pBStack_40 = (BINDING *)(**(code **)((long)parser + 0x18))(0x30);
    if (pBStack_40 == (BINDING *)0x0) {
      return 0;
    }
    pXVar1 = (XML_Char *)(**(code **)((long)parser + 0x18))((long)(local_44 + 0x18));
    pBStack_40->uri = pXVar1;
    if (pBStack_40->uri == (XML_Char *)0x0) {
      (**(code **)((long)parser + 0x28))(pBStack_40);
      return 0;
    }
    pBStack_40->uriAlloc = local_44 + 0x18;
  }
  else {
    pBStack_40 = *(BINDING **)((long)parser + 1000);
    if (pBStack_40->uriAlloc < local_44) {
      pXVar1 = (XML_Char *)
               (**(code **)((long)parser + 0x20))(pBStack_40->uri,(long)(local_44 + 0x18));
      pBStack_40->uri = pXVar1;
      if (pBStack_40->uri == (XML_Char *)0x0) {
        return 0;
      }
      pBStack_40->uriAlloc = local_44 + 0x18;
    }
    *(binding **)((long)parser + 1000) = pBStack_40->nextTagBinding;
  }
  pBStack_40->uriLen = local_44;
  memcpy(pBStack_40->uri,uri,(long)local_44);
  if (*(char *)((long)parser + 0x488) != '\0') {
    pBStack_40->uri[local_44 + -1] = *(XML_Char *)((long)parser + 0x488);
  }
  pBStack_40->prefix = prefix;
  pBStack_40->attId = attId;
  pBStack_40->prevPrefixBinding = prefix->binding;
  if ((*uri == '\0') && (prefix == (PREFIX *)((long)parser + 0x390))) {
    prefix->binding = (BINDING *)0x0;
  }
  else {
    prefix->binding = pBStack_40;
  }
  pBStack_40->nextTagBinding = *bindingsPtr;
  *bindingsPtr = pBStack_40;
  if (*(long *)((long)parser + 200) != 0) {
    local_68 = uri;
    if (prefix->binding == (BINDING *)0x0) {
      local_68 = (XML_Char *)0x0;
    }
    (**(code **)((long)parser + 200))(*(undefined8 *)((long)parser + 8),prefix->name,local_68);
  }
  return 1;
}

Assistant:

static
int addBinding(XML_Parser parser, PREFIX *prefix, const ATTRIBUTE_ID *attId, const XML_Char *uri, BINDING **bindingsPtr)
{
  BINDING *b;
  int len;
  for (len = 0; uri[len]; len++)
    ;
  if (namespaceSeparator)
    len++;
  if (freeBindingList) {
    b = freeBindingList;
    if (len > b->uriAlloc) {
      b->uri = REALLOC(b->uri, sizeof(XML_Char) * (len + EXPAND_SPARE));
      if (!b->uri)
        return 0;
      b->uriAlloc = len + EXPAND_SPARE;
    }
    freeBindingList = b->nextTagBinding;
  }
  else {
    b = MALLOC(sizeof(BINDING));
    if (!b)
      return 0;
    b->uri = MALLOC(sizeof(XML_Char) * (len + EXPAND_SPARE));
    if (!b->uri) {
      FREE(b);
      return 0;
    }
    b->uriAlloc = len + EXPAND_SPARE;
  }
  b->uriLen = len;
  memcpy(b->uri, uri, len * sizeof(XML_Char));
  if (namespaceSeparator)
    b->uri[len - 1] = namespaceSeparator;
  b->prefix = prefix;
  b->attId = attId;
  b->prevPrefixBinding = prefix->binding;
  if (*uri == XML_T('\0') && prefix == &dtd.defaultPrefix)
    prefix->binding = 0;
  else
    prefix->binding = b;
  b->nextTagBinding = *bindingsPtr;
  *bindingsPtr = b;
  if (startNamespaceDeclHandler)
    startNamespaceDeclHandler(handlerArg, prefix->name,
                              prefix->binding ? uri : 0);
  return 1;
}